

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_b10_sx_sy_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint32_t in_stack_0000006c;
  undefined4 in_stack_00000074;
  uint32_t in_stack_0000007c;
  uint16_t *in_stack_00000080;
  uint32_t in_stack_0000008c;
  uint16_t *in_stack_00000090;
  uint8_t *in_stack_00000190;
  uint32_t in_stack_00000198;
  int in_stack_000001a0;
  blend_unit_fn in_stack_000001a8;
  
  blend_a64_mask_bn_sx_sy_w4_sse4_1
            (in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_0000007c,
             (uint16_t *)CONCAT44(in_stack_00000074,w),in_stack_0000006c,in_stack_00000190,
             in_stack_00000198,in_stack_000001a0,in_stack_000001a8);
  return;
}

Assistant:

static void blend_a64_mask_b10_sx_sy_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;
  blend_a64_mask_bn_sx_sy_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, h,
                                    blend_4_b10);
}